

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O0

size_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::move
          (Threads<xmrig::CpuThreads> *this,char *profile,CpuThreads *threads)

{
  bool bVar1;
  size_t count;
  pair<const_xmrig::String,_xmrig::CpuThreads> *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  pair<const_xmrig::String,_xmrig::CpuThreads> *in_stack_ffffffffffffff70;
  Threads<xmrig::CpuThreads> *in_stack_ffffffffffffff90;
  pair<const_xmrig::String,_xmrig::CpuThreads> local_60;
  size_t local_28;
  size_t local_8;
  
  bVar1 = has(in_stack_ffffffffffffff90);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    local_28 = CpuThreads::count((CpuThreads *)0x1f31c5);
    bVar1 = CpuThreads::isEmpty((CpuThreads *)0x1f31da);
    if (!bVar1) {
      this_00 = &local_60;
      std::pair<const_xmrig::String,_xmrig::CpuThreads>::
      pair<const_char_*&,_xmrig::CpuThreads,_true>
                (in_stack_ffffffffffffff70,
                 (char **)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (CpuThreads *)this_00);
      std::
      map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
      ::insert((map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
                *)in_stack_ffffffffffffff70,
               (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::pair<const_xmrig::String,_xmrig::CpuThreads>::~pair(this_00);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }